

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O1

CURLcode canon_query(Curl_easy *data,char *query,dynbuf *dq)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  char *pcVar7;
  size_t len;
  size_t sVar8;
  char *p;
  byte *mem;
  byte *mem_00;
  size_t sVar9;
  size_t *psVar10;
  ulong uVar11;
  bool bVar12;
  char tmp [3];
  pair array [64];
  byte local_44c [4];
  size_t local_448;
  ulong local_440;
  size_t local_438 [129];
  
  if (query == (char *)0x0) {
    return CURLE_OK;
  }
  psVar10 = local_438;
  sVar8 = 0;
  do {
    sVar9 = sVar8;
    *psVar10 = (size_t)query;
    pcVar7 = strchr(query,0x26);
    if (pcVar7 == (char *)0x0) {
      sVar8 = strlen(query);
      psVar10[1] = sVar8;
    }
    else {
      psVar10[1] = (long)pcVar7 - (long)query;
      psVar10 = psVar10 + 2;
      query = pcVar7 + 1;
    }
    sVar8 = sVar9 + 1;
  } while ((pcVar7 != (char *)0x0) && ((uint)sVar9 < 0x3f));
  if ((int)sVar8 == 0x40) {
    Curl_failf(data,"aws-sigv4: too many query pairs in URL");
    CVar6 = CURLE_URL_MALFORMAT;
  }
  else {
    psVar10 = local_438;
    qsort(psVar10,sVar8,0x10,compare_func);
    uVar11 = 0;
    CVar5 = CURLE_OK;
    local_448 = sVar9;
    do {
      sVar8 = psVar10[1];
      if (sVar8 != 0) {
        bVar12 = CVar5 == CURLE_OK;
        if (bVar12) {
          mem_00 = (byte *)*psVar10;
          bVar2 = false;
          local_440 = uVar11;
          do {
            bVar1 = *mem_00;
            if (((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
LAB_006b4343:
              len = 1;
              mem = mem_00;
LAB_006b434e:
              CVar5 = Curl_dyn_addn(dq,mem,len);
            }
            else {
              if (bVar1 < 0x3d) {
                if (bVar1 - 0x2d < 2) goto LAB_006b4343;
                if (bVar1 != 0x25) goto LAB_006b437f;
                if ((((byte)(mem_00[1] - 0x30) < 10) ||
                    ((uVar4 = mem_00[1] - 0x41, uVar4 < 0x26 &&
                     ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) != 0)))) &&
                   (((byte)(mem_00[2] - 0x30) < 10 ||
                    ((uVar4 = mem_00[2] - 0x41, uVar4 < 0x26 &&
                     ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) != 0)))))) {
                  local_44c[2] = 0;
                  local_44c[0] = 0x25;
                  local_44c[1] = 0;
                  cVar3 = Curl_raw_toupper(mem_00[1]);
                  local_44c[1] = cVar3;
                  local_44c[2] = Curl_raw_toupper(mem_00[2]);
                  CVar5 = Curl_dyn_addn(dq,local_44c,3);
                  sVar8 = sVar8 - 2;
                  mem_00 = mem_00 + 2;
                  uVar11 = local_440;
                  goto LAB_006b4353;
                }
                len = 3;
                mem = (byte *)"%25";
                goto LAB_006b434e;
              }
              if (bVar1 != 0x3d) {
                if ((bVar1 == 0x7e) || (bVar1 == 0x5f)) goto LAB_006b4343;
LAB_006b437f:
                local_44c[1] = "0123456789ABCDEF"[*mem_00 >> 4];
                local_44c[0] = 0x25;
                local_44c[2] = "0123456789ABCDEF"[*mem_00 & 0xf];
                len = 3;
                mem = local_44c;
                goto LAB_006b434e;
              }
              CVar5 = Curl_dyn_addn(dq,mem_00,1);
              bVar2 = true;
            }
LAB_006b4353:
            bVar12 = CVar5 == CURLE_OK;
            sVar8 = sVar8 - 1;
            sVar9 = local_448;
          } while ((sVar8 != 0) && (mem_00 = mem_00 + 1, CVar5 == CURLE_OK));
        }
        else {
          bVar2 = false;
        }
        if (bVar12) {
          CVar5 = CURLE_OK;
        }
        if (bVar12 == true && !bVar2) {
          CVar5 = Curl_dyn_addn(dq,"=",1);
        }
        if ((CVar5 == CURLE_OK) && (CVar5 = CURLE_OK, (uint)uVar11 < (uint)sVar9)) {
          CVar5 = Curl_dyn_addn(dq,"&",1);
        }
      }
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      uVar4 = (uint)uVar11;
      psVar10 = psVar10 + 2;
      uVar11 = (ulong)(uVar4 + 1);
      CVar6 = CURLE_OK;
    } while (uVar4 < (uint)sVar9);
  }
  return CVar6;
}

Assistant:

static CURLcode canon_query(struct Curl_easy *data,
                            const char *query, struct dynbuf *dq)
{
  CURLcode result = CURLE_OK;
  int entry = 0;
  int i;
  const char *p = query;
  struct pair array[MAX_QUERYPAIRS];
  struct pair *ap = &array[0];
  if(!query)
    return result;

  /* sort the name=value pairs first */
  do {
    char *amp;
    entry++;
    ap->p = p;
    amp = strchr(p, '&');
    if(amp)
      ap->len = amp - p; /* excluding the ampersand */
    else {
      ap->len = strlen(p);
      break;
    }
    ap++;
    p = amp + 1;
  } while(entry < MAX_QUERYPAIRS);
  if(entry == MAX_QUERYPAIRS) {
    /* too many query pairs for us */
    failf(data, "aws-sigv4: too many query pairs in URL");
    return CURLE_URL_MALFORMAT;
  }

  qsort(&array[0], entry, sizeof(struct pair), compare_func);

  ap = &array[0];
  for(i = 0; !result && (i < entry); i++, ap++) {
    size_t len;
    const char *q = ap->p;
    bool found_equals = false;
    if(!ap->len)
      continue;
    for(len = ap->len; len && !result; q++, len--) {
      if(ISALNUM(*q))
        result = Curl_dyn_addn(dq, q, 1);
      else {
        switch(*q) {
        case '-':
        case '.':
        case '_':
        case '~':
          /* allowed as-is */
          result = Curl_dyn_addn(dq, q, 1);
          break;
        case '=':
          /* allowed as-is */
          result = Curl_dyn_addn(dq, q, 1);
          found_equals = true;
          break;
        case '%':
          /* uppercase the following if hexadecimal */
          if(ISXDIGIT(q[1]) && ISXDIGIT(q[2])) {
            char tmp[3]="%";
            tmp[1] = Curl_raw_toupper(q[1]);
            tmp[2] = Curl_raw_toupper(q[2]);
            result = Curl_dyn_addn(dq, tmp, 3);
            q += 2;
            len -= 2;
          }
          else
            /* '%' without a following two-digit hex, encode it */
            result = Curl_dyn_addn(dq, "%25", 3);
          break;
        default: {
          /* URL encode */
          const char hex[] = "0123456789ABCDEF";
          char out[3]={'%'};
          out[1] = hex[((unsigned char)*q)>>4];
          out[2] = hex[*q & 0xf];
          result = Curl_dyn_addn(dq, out, 3);
          break;
        }
        }
      }
    }
    if(!result && !found_equals) {
      /* queries without value still need an equals */
      result = Curl_dyn_addn(dq, "=", 1);
    }
    if(!result && i < entry - 1) {
      /* insert ampersands between query pairs */
      result = Curl_dyn_addn(dq, "&", 1);
    }
  }
  return result;
}